

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_global(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  vm_obj_id_t obj;
  uint uVar1;
  int iVar2;
  CVmObject *pCVar3;
  vm_bif_desc *pvVar4;
  array_list_ele_t *paVar5;
  long in_RDI;
  vm_bif_desc *desc;
  ushort func_idx;
  ushort set_idx;
  CVmFuncPtr fp;
  tc_metaclass_t meta;
  CVmObjClass *cl;
  vm_val_t symval;
  vm_val_t symstr;
  CTcSymbol *ret;
  undefined4 in_stack_fffffffffffffeb8;
  tctarg_prop_id_t prop;
  pool_ofs_t in_stack_fffffffffffffebc;
  CVmFuncPtr *in_stack_fffffffffffffec0;
  tctarg_obj_id_t class_obj;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  vm_obj_id_t in_stack_fffffffffffffed4;
  vm_obj_id_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  CTcSymFuncObj *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  tc_metaclass_t in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  CTcDictEntry *in_stack_ffffffffffffff08;
  CTcSymFunc *this_00;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  undefined1 local_68 [40];
  uint local_40;
  vm_val_t local_38;
  array_list_ele_t *local_28;
  array_list_ele_t *local_8;
  
  prop = (tctarg_prop_id_t)((uint)in_stack_fffffffffffffeb8 >> 0x10);
  if (*(int *)(in_RDI + 0x38) == 0) {
    local_8 = (array_list_ele_t *)0x0;
  }
  else {
    local_28 = (array_list_ele_t *)0x0;
    obj = CVmObjString::create
                    (in_stack_fffffffffffffed4,
                     (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (size_t)in_stack_fffffffffffffec0);
    vm_val_t::set_obj(&local_38,obj);
    CVmStack::push(&local_38);
    vm_objp(0);
    CVmObject::index_val_ov
              ((CVmObject *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (vm_val_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed4,
               (vm_val_t *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    CVmStack::push((vm_val_t *)(local_68 + 0x20));
    switch(local_68._32_4_) {
    case 5:
      iVar2 = CVmObjClass::is_intcls_obj(0);
      class_obj = (tctarg_obj_id_t)((ulong)in_stack_fffffffffffffec0 >> 0x20);
      if (iVar2 == 0) {
        pCVar3 = vm_objp(0);
        iVar2 = (*pCVar3->_vptr_CVmObject[0xe])(pCVar3,0);
        if (iVar2 == 0) {
          local_68._8_4_ = 0xffffffff;
          iVar2 = CVmObjTads::is_tadsobj_obj(0);
          if (iVar2 == 0) {
            iVar2 = CVmObjGramProd::is_gramprod_obj(0);
            if (iVar2 == 0) {
              iVar2 = CVmObjDict::is_dictionary_obj(0);
              if (iVar2 == 0) {
                iVar2 = CVmObjIntClsMod::is_intcls_mod_obj(0);
                if (iVar2 != 0) {
                  local_68._8_4_ = 3;
                }
              }
              else {
                local_68._8_4_ = 1;
              }
            }
            else {
              local_68._8_4_ = 2;
            }
          }
          else {
            local_68._8_4_ = 0;
          }
          paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x330f2d);
          CTcSymObj::CTcSymObj
                    (&in_stack_fffffffffffffef0->super_CTcSymObj,
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                     in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
          local_28 = paVar5;
        }
        else {
          paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x330e18);
          CTcSymFuncObj::CTcSymFuncObj
                    (in_stack_fffffffffffffef0,
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                     in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
          local_28 = paVar5;
        }
      }
      else {
        local_68._24_8_ = vm_objp(0);
        paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x330d3d);
        CVmObjClass::get_meta_idx((CVmObjClass *)0x330d72);
        CTcSymMetaclass::CTcSymMetaclass
                  ((CTcSymMetaclass *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,class_obj);
        local_28 = paVar5;
      }
      break;
    case 6:
      paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x330fc2);
      CTcSymProp::CTcSymProp
                ((CTcSymProp *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (size_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,prop);
      local_28 = paVar5;
      break;
    default:
      local_28 = (array_list_ele_t *)0x0;
      break;
    case 0xc:
      this_00 = (CTcSymFunc *)local_68;
      CVmFuncPtr::CVmFuncPtr(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x33104c);
      CVmFuncPtr::get_min_argc((CVmFuncPtr *)0x331075);
      uVar1 = CVmFuncPtr::get_opt_argc((CVmFuncPtr *)local_68);
      iVar2 = CVmFuncPtr::is_varargs((CVmFuncPtr *)0x33109b);
      CTcSymFunc::CTcSymFunc
                (this_00,(char *)CONCAT44(uVar1,iVar2),in_stack_fffffffffffffef8,
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffeec,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff58);
      local_28 = paVar5;
      (**(code **)(*(long *)paVar5 + 0x110))(paVar5,local_40);
      break;
    case 0xf:
      paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x33114b);
      CTcSymEnum::CTcSymEnum
                ((CTcSymEnum *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,(ulong)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffebc);
      local_28 = paVar5;
      break;
    case 0x10:
      local_28 = (array_list_ele_t *)0x0;
      pvVar4 = CVmBifTable::get_desc(G_bif_table_X,local_40 & 0xffff,local_40 >> 0x10);
      if ((pvVar4 != (vm_bif_desc *)0x0) && (pvVar4->func != (_func_void_uint *)0x0)) {
        paVar5 = (array_list_ele_t *)CTcSymbolBase::operator_new(0x331235);
        CTcSymBif::CTcSymBif
                  ((CTcSymBif *)in_stack_ffffffffffffff08,
                   (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,(int)((ulong)paVar5 >> 0x20),
                   (ushort)((ulong)paVar5 >> 0x10),(ushort)paVar5,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
        local_28 = paVar5;
      }
    }
    CVmStack::discard(2);
    local_8 = local_28;
  }
  return (CTcSymbol *)local_8;
}

Assistant:

CTcSymbol *find_global(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (globals_ == VM_INVALID_OBJ)
            return 0;

        /* presume we won't find a symbol */
        CTcSymbol *ret = 0;
        
        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* create a string for the symbol name; stack it for gc protection */
        vm_val_t symstr;
        symstr.set_obj(CVmObjString::create(vmg_ FALSE, sym, len));
        G_stk->push(&symstr);

        /* look up the symbol string in the table */
        vm_val_t symval;
        vm_objp(vmg_ globals_)->index_val_ov(vmg_ &symval, globals_, &symstr);
        G_stk->push(&symval);

        /* check what we found */
        switch (symval.typ)
        {
        case VM_OBJ:
            /* it's an object - map it to CTcSymObj or CTcSymMetaclass */
            if (CVmObjClass::is_intcls_obj(vmg_ symval.val.obj))
            {
                /* 
                 *   it's an IntrinsicClass object - this represents a
                 *   metaclass, so map it to a CTcSymMetaclass symbol 
                 */
                CVmObjClass *cl = (CVmObjClass *)vm_objp(vmg_ symval.val.obj);
                ret = new CTcSymMetaclass(sym, len, FALSE,
                                          cl->get_meta_idx(),
                                          symval.val.obj);
            }
            else if (vm_objp(vmg_ symval.val.obj)->get_invoker(vmg_ 0))
            {
                /* 
                 *   it's an invokable object - create a function-like object
                 *   symbol for it 
                 */
                ret = new CTcSymFuncObj(sym, len, FALSE, symval.val.obj,
                                        FALSE, TC_META_UNKNOWN, 0);
            }
            else
            {
                /* 
                 *   It's not an IntrinsicClass object, so it's a regular
                 *   CTcSymObj symbol.  Check for special metaclasses that
                 *   the compiler is aware of.  
                 */
                tc_metaclass_t meta = TC_META_UNKNOWN;

                if (CVmObjTads::is_tadsobj_obj(vmg_ symval.val.obj))
                    meta = TC_META_TADSOBJ;
                else if (CVmObjGramProd::is_gramprod_obj(vmg_ symval.val.obj))
                    meta = TC_META_GRAMPROD;
                else if (CVmObjDict::is_dictionary_obj(vmg_ symval.val.obj))
                    meta = TC_META_DICT;
                else if (CVmObjIntClsMod::is_intcls_mod_obj(vmg_ symval.val.obj))
                    meta = TC_META_ICMOD;

                /* create the object symbol */
                ret = new CTcSymObj(sym, len, FALSE, symval.val.obj,
                                    FALSE, meta, 0);
            }